

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

optional<real_token> *
read_real(optional<real_token> *__return_storage_ptr__,string_view buf_1,string_view buf_2)

{
  string_view buf;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view buf_00;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  double *pdVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  optional<double> oVar6;
  real_token local_138;
  real_token local_128;
  size_t local_118;
  char *local_110;
  _Storage<double,_true> local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  real_token local_f8;
  real_token local_e8;
  bool local_d8;
  undefined7 uStack_d7;
  char *local_d0;
  _Storage<double,_true> local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b8;
  size_t local_a8;
  char *local_a0;
  real_token local_98;
  real_token local_88;
  bool local_78;
  undefined7 uStack_77;
  char *local_70;
  _Storage<double,_true> local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_58;
  size_t local_48;
  char *local_40;
  _Storage<double,_true> local_38;
  optional<double> value_opt;
  string_view buf_2_local;
  string_view buf_1_local;
  
  pcVar5 = buf_2._M_str;
  value_opt.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>
  ._8_8_ = buf_2._M_len;
  pcVar3 = buf_1._M_str;
  sVar4 = buf_1._M_len;
  std::optional<double>::optional((optional<double> *)&local_38);
  local_48 = sVar4;
  local_40 = pcVar3;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"-");
  __x_00._M_str = local_40;
  __x_00._M_len = local_48;
  bVar1 = std::operator==(__x_00,local_58);
  if (bVar1) {
    local_78 = value_opt.super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_engaged;
    uStack_77 = value_opt.super__Optional_base<double,_true,_true>._M_payload.
                super__Optional_payload_base<double>._9_7_;
    buf_00._M_str = pcVar5;
    buf_00._M_len =
         value_opt.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>._8_8_;
    local_70 = pcVar5;
    oVar6 = read_real(buf_00);
    local_68 = oVar6.super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_payload;
    local_60 = oVar6.super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_engaged;
    value_opt.super__Optional_base<double,_true,_true>._M_payload.
    super__Optional_payload_base<double>._M_payload._1_7_ = uStack_5f;
    value_opt.super__Optional_base<double,_true,_true>._M_payload.
    super__Optional_payload_base<double>._M_payload._0_1_ = local_60;
    local_38 = local_68;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_38);
    if (bVar1) {
      pdVar2 = std::optional<double>::operator*((optional<double> *)&local_38);
      real_token::real_token(&local_98,-*pdVar2,2);
      std::optional<real_token>::optional<real_token,_true>(__return_storage_ptr__,&local_98);
    }
    else {
      real_token::real_token(&local_88,-1.0,1);
      std::optional<real_token>::optional<real_token,_true>(__return_storage_ptr__,&local_88);
    }
  }
  else {
    local_a8 = sVar4;
    local_a0 = pcVar3;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"+");
    __x._M_str = local_a0;
    __x._M_len = local_a8;
    bVar1 = std::operator==(__x,local_b8);
    if (bVar1) {
      local_d8 = value_opt.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_engaged;
      uStack_d7 = value_opt.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._9_7_;
      buf._M_str = pcVar5;
      buf._M_len = value_opt.super__Optional_base<double,_true,_true>._M_payload.
                   super__Optional_payload_base<double>._8_8_;
      local_d0 = pcVar5;
      oVar6 = read_real(buf);
      local_c8 = oVar6.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      local_c0 = oVar6.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_engaged;
      value_opt.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._1_7_ = uStack_bf;
      value_opt.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ = local_c0;
      local_38 = local_c8;
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_38);
      if (bVar1) {
        pdVar2 = std::optional<double>::operator*((optional<double> *)&local_38);
        real_token::real_token(&local_f8,*pdVar2,2);
        std::optional<real_token>::optional<real_token,_true>(__return_storage_ptr__,&local_f8);
      }
      else {
        real_token::real_token(&local_e8,1.0,1);
        std::optional<real_token>::optional<real_token,_true>(__return_storage_ptr__,&local_e8);
      }
    }
    else {
      local_118 = sVar4;
      local_110 = pcVar3;
      oVar6 = read_real(buf_1);
      local_108 = oVar6.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      local_100 = oVar6.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_engaged;
      value_opt.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._1_7_ = uStack_ff;
      value_opt.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ = local_100;
      local_38 = local_108;
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_38);
      if (bVar1) {
        pdVar2 = std::optional<double>::operator*((optional<double> *)&local_38);
        real_token::real_token(&local_138,*pdVar2,1);
        std::optional<real_token>::optional<real_token,_true>(__return_storage_ptr__,&local_138);
      }
      else {
        real_token::real_token(&local_128,1.0,0);
        std::optional<real_token>::optional<real_token,_true>(__return_storage_ptr__,&local_128);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<real_token>
read_real(const std::string_view buf_1, const std::string_view buf_2) noexcept
{
    std::optional<double> value_opt;

    if (buf_1 == "-") {
        value_opt = read_real(buf_2);
        if (!value_opt)
            return real_token(-1.0, 1);
        else
            return real_token(-1.0 * *value_opt, 2);
    }

    if (buf_1 == "+") {
        value_opt = read_real(buf_2);
        if (!value_opt)
            return real_token(1.0, 1);
        else
            return real_token(*value_opt, 2);
    }

    value_opt = read_real(buf_1);
    if (!value_opt)
        return real_token(1.0, 0);

    return real_token(*value_opt, 1);
}